

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

bool __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Reduce(MI<6UL,_GF2::MOGrevlex<6UL>_> *this,iterator pos)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  MM<6UL> lm;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  Geobucket<2UL> gb;
  WW<6UL> local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_node_base local_80;
  long local_70;
  Geobucket<2UL> local_60;
  
  p_Var3 = pos._M_node + 1;
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::Geobucket
            (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)p_Var3);
  local_88 = p_Var3;
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)p_Var3);
  local_98._words[0] = (word  [1])0;
  local_90 = (_List_node_base *)0x0;
  local_70 = 0;
  local_80._M_next = &local_80;
  local_80._M_prev = &local_80;
  do {
    bVar1 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::PopLM(&local_60,(MM<6UL> *)&local_98);
    p_Var3 = local_80._M_next;
    if (!bVar1) {
      while (p_Var3 != &local_80) {
        p_Var4 = p_Var3->_M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var4;
      }
      if (local_60._maxsizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60._maxsizes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
      ::~vector(&local_60._buckets);
      return (bool)((byte)local_90 & 1);
    }
    p_Var3 = (this->
             super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ).
             super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
LAB_00134711:
    if (p_Var3 == (_List_node_base *)this) goto LAB_001347d3;
    if (p_Var3 == pos._M_node) {
LAB_0013474f:
      p_Var3 = p_Var3->_M_next;
      goto LAB_00134711;
    }
    iVar2 = MOGrevlex<6UL>::Compare
                      ((MOGrevlex<6UL> *)&this->field_0x18,(MM<6UL> *)(p_Var3[1]._M_next + 1),
                       (MM<6UL> *)&local_98);
    if (0 < iVar2) goto LAB_001347d3;
    p_Var4 = p_Var3 + 1;
    if (((ulong)p_Var4->_M_next[1]._M_next & ~(ulong)local_98._words[0]) != 0) goto LAB_0013474f;
    if (p_Var4 != &local_80) {
      std::__cxx11::list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>>::
      _M_assign_dispatch<std::_List_const_iterator<GF2::MM<6ul>>>
                ((list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80,p_Var4->_M_next,p_Var4
                );
    }
    local_90 = local_80._M_next;
    local_70 = local_70 + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(local_90,0x18);
    local_98._words[0] = (word  [1])(~(ulong)p_Var4->_M_next[1]._M_next & (ulong)local_98._words[0])
    ;
    for (p_Var4 = local_80._M_next; p_Var4 != &local_80; p_Var4 = p_Var4->_M_next) {
      p_Var4[1]._M_next = (_List_node_base *)((ulong)p_Var4[1]._M_next | (ulong)local_98._words[0]);
    }
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Normalize((MP<6UL,_GF2::MOGrevlex<6UL>_> *)&local_80);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::SymDiffSplice
              (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)&local_80);
    local_90 = (_List_node_base *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if (p_Var3 == (_List_node_base *)this) {
LAB_001347d3:
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)local_98._words[0];
      std::__detail::_List_node_base::_M_hook(p_Var3);
      pos._M_node[2]._M_next = (_List_node_base *)((long)&(pos._M_node[2]._M_next)->_M_next + 1);
    }
  } while( true );
}

Assistant:

bool Reduce(iterator pos)
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(*pos);
		// будем сохранять в *pos остаток
		pos->SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// пропускаем многочлен в позиции pos
				if (iterPoly == pos) continue;
				// все остальное без изменений
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				else if (iterPoly->LM() | lm)
				{
					changed = true;
					(poly = *iterPoly).PopLM();
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					break;
				}
			}
			if (iterPoly == end()) pos->push_back(lm);
		}
		return changed;
	}